

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

int uv__next_timeout(uv_loop_t *loop)

{
  heap_node *phVar1;
  ulong local_30;
  uint64_t diff;
  uv_timer_t *handle;
  heap_node *heap_node;
  uv_loop_t *loop_local;
  
  phVar1 = heap_min((heap *)&loop->timer_heap);
  if (phVar1 == (heap_node *)0x0) {
    loop_local._4_4_ = -1;
  }
  else if ((heap_node *)loop->time < phVar1[1].left) {
    local_30 = (long)phVar1[1].left - loop->time;
    if (0x7fffffff < local_30) {
      local_30 = 0x7fffffff;
    }
    loop_local._4_4_ = (int)local_30;
  }
  else {
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv__next_timeout(const uv_loop_t* loop) {
  const struct heap_node* heap_node;
  const uv_timer_t* handle;
  uint64_t diff;

  heap_node = heap_min((const struct heap*) &loop->timer_heap);
  if (heap_node == NULL)
    return -1; /* block indefinitely */

  handle = container_of(heap_node, uv_timer_t, heap_node);
  if (handle->timeout <= loop->time)
    return 0;

  diff = handle->timeout - loop->time;
  if (diff > INT_MAX)
    diff = INT_MAX;

  return diff;
}